

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O0

void __thiscall
Importer_resolveImportsFromFileLevel0_Test::~Importer_resolveImportsFromFileLevel0_Test
          (Importer_resolveImportsFromFileLevel0_Test *this)

{
  Importer_resolveImportsFromFileLevel0_Test *this_local;
  
  ~Importer_resolveImportsFromFileLevel0_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, resolveImportsFromFileLevel0)
{
    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(fileContents("level0.xml"));
    auto importer = libcellml::Importer::create();

    EXPECT_EQ(size_t(0), p->issueCount());

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath());
    EXPECT_FALSE(model->hasUnresolvedImports());
}